

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-dynamical-system.cpp
# Opt level: O2

Vector __thiscall
stateObservation::IMUDynamicalSystem::stateDynamics
          (IMUDynamicalSystem *this,Vector *x,Vector *u,TimeIndex param_3)

{
  Index *scalar;
  double *pdVar1;
  Index rows;
  Index extraout_RDX;
  Vector VVar2;
  Vector xk1;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> local_1a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_170;
  Vector3 orientationV;
  Vector3 angularVelocity;
  Vector3 velocity;
  Vector3 position;
  AngleAxis orientationAA;
  Vector3 angularJerkInput;
  Vector3 linearJerkInput;
  Vector3 gyroBias;
  Vector3 angularAcceleration;
  Vector3 acceleration;
  Quaternion orientation;
  
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,(Vector *)param_3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,0,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&position,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,6,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&velocity,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,0xc,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&acceleration,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,3,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&orientationV,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,9,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocity,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,0xf,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularAcceleration,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  if (*(char *)&x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data == '\x01') {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_1a0,u,0x12,3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              (&gyroBias,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_1a0);
  }
  computeQuaternion_(&orientation,(IMUDynamicalSystem *)x,&orientationV);
  kine::integrateKinematics
            (&position,&velocity,&acceleration,&orientation,&angularVelocity,&angularAcceleration,
             (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  rows = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[5])(x);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&local_1a0,rows,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xk1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_1a0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_1a0,&xk1,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1a0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&position);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_1a0,&xk1,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1a0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&velocity);
  Eigen::AngleAxis<double>::operator=
            (&orientationAA,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&orientation);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_1a0,&orientationAA.m_angle,(StorageBaseType *)&orientationAA);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&orientationV,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&local_1a0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_1a0,&xk1,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1a0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,
             &orientationV);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_1a0,&xk1,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1a0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,
             &angularVelocity);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<3>
            ((Type *)&local_1a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_3,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&linearJerkInput,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<3>
            ((Type *)&local_1a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_3,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularJerkInput,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_1a0);
  scalar = &x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            (&local_170,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&linearJerkInput,
             (double *)scalar);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_1a0,&xk1,0xc,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_1a0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_170);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            (&local_170,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularJerkInput,
             (double *)scalar);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock(&local_1a0,&xk1,0xf,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_1a0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_170);
  if (*(char *)&x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data == '\x01') {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (&local_170,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&gyroBias,(double *)&one_);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              (&local_1a0,&xk1,0x12,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (&local_1a0.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,
               &local_170);
  }
  pdVar1 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 == (double *)0x0) {
    (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
         (_func_int **)
         xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
         (_func_int **)
         xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  }
  else {
    (**(code **)((long)*pdVar1 + 0x10))(this,pdVar1,&xk1);
  }
  free(xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUDynamicalSystem::stateDynamics(const Vector & x, const Vector & u, TimeIndex)
{
  assertStateVector_(x);
  assertInputVector_(u);

  Vector3 position = x.segment<3>(indexes::pos);
  Vector3 velocity = x.segment<3>(indexes::linVel);
  Vector3 acceleration = x.segment<3>(indexes::linAcc);

  Vector3 orientationV = x.segment<3>(indexes::ori);
  Vector3 angularVelocity = x.segment<3>(indexes::angVel);
  Vector3 angularAcceleration = x.segment<3>(indexes::angAcc);

  Vector3 gyroBias;
  if(withGyroBias_)
  {
    gyroBias = x.segment<3>(indexes::gyroBias);
  }

  Quaternion orientation = computeQuaternion_(orientationV);

  kine::integrateKinematics(position, velocity, acceleration, orientation, angularVelocity, angularAcceleration, dt_);

  // x_{k+1}
  Vector xk1 = Vector::Zero(getStateSize(), 1);

  xk1.segment<3>(indexes::pos) = position;
  xk1.segment<3>(indexes::linVel) = velocity;

  AngleAxis orientationAA(orientation);

  orientationV = orientationAA.angle() * orientationAA.axis();

  xk1.segment<3>(indexes::ori) = orientationV;
  xk1.segment<3>(indexes::angVel) = angularVelocity;

  // inputs
  Vector3 linearJerkInput = u.head<3>();
  Vector3 angularJerkInput = u.tail<3>();

  xk1.segment<3>(indexes::linAcc) += linearJerkInput * dt_;
  xk1.segment<3>(indexes::angAcc) += angularJerkInput * dt_;

  if(withGyroBias_)
  {
    xk1.segment<3>(indexes::gyroBias) = gyroBias * one_;
  }

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}